

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O1

int secp256r1sha256_sign
              (ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
              uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
              uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t *puVar1;
  int iVar2;
  uECC_Curve curve;
  size_t sVar3;
  size_t body_size;
  int iVar4;
  bool bVar5;
  uint8_t sig [64];
  undefined1 local_ca;
  undefined1 local_c9;
  uint8_t local_c8 [32];
  cf_sha256_context local_a8;
  
  bVar5 = num_algorithms == 0;
  if (bVar5) {
    return 0x28;
  }
  if (*algorithms != 0x403) {
    sVar3 = 1;
    do {
      bVar5 = num_algorithms == sVar3;
      if (bVar5) {
        return 0x28;
      }
      puVar1 = algorithms + sVar3;
      sVar3 = sVar3 + 1;
    } while (*puVar1 != 0x403);
  }
  if (bVar5) {
    return 0x28;
  }
  cf_sha256_init(&local_a8);
  cf_sha256_update(&local_a8,input.base,input.len);
  cf_sha256_digest_final(&local_a8,local_c8);
  (*ptls_clear_memory)(&local_a8,0x70);
  curve = uECC_secp256r1();
  uECC_sign((uint8_t *)(_self + 1),local_c8,0x20,(uint8_t *)&local_a8,curve);
  local_c9 = 0x30;
  iVar2 = ptls_buffer__do_pushv(outbuf,&local_c9,1);
  if (iVar2 != 0) goto LAB_0012f30a;
  local_ca = 0xff;
  iVar2 = ptls_buffer__do_pushv(outbuf,&local_ca,1);
  if (iVar2 != 0) goto LAB_0012f30a;
  sVar3 = outbuf->off;
  iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,&local_a8,0x20);
  iVar4 = 9;
  if ((iVar2 == 0) &&
     (iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,local_a8.partial,0x20), iVar2 == 0)) {
    body_size = outbuf->off - sVar3;
    if (body_size < 0x80) {
      outbuf->base[sVar3 - 1] = (uint8_t)body_size;
    }
    else {
      iVar2 = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size);
      if (iVar2 != 0) goto LAB_0012f37b;
    }
    iVar2 = 0;
    iVar4 = 0;
  }
LAB_0012f37b:
  if (iVar4 != 9) {
    if (iVar4 != 0) {
      return iVar2;
    }
    *selected_algorithm = 0x403;
    iVar2 = 0;
  }
LAB_0012f30a:
  (*ptls_clear_memory)(local_c8,0x20);
  (*ptls_clear_memory)(&local_a8,0x40);
  return iVar2;
}

Assistant:

static int secp256r1sha256_sign(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                                ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_minicrypto_secp256r1sha256_sign_certificate_t *self = (ptls_minicrypto_secp256r1sha256_sign_certificate_t *)_self;
    uint8_t hash[32], sig[64];
    size_t i;
    int ret;

    /* check algorithm */
    for (i = 0; i != num_algorithms; ++i)
        if (algorithms[i] == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256)
            break;
    if (i == num_algorithms)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(self->key, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    *selected_algorithm = PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256;
    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}